

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cc
# Opt level: O3

uchar * __thiscall phosg::MD5::MD5(MD5 *this,uchar *d,size_t n,uchar *md)

{
  uint uVar1;
  size_t x_1;
  size_t sVar2;
  ulong uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint32_t uVar10;
  uint uVar11;
  uint uVar12;
  uint32_t uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  uint32_t uVar18;
  uint uVar19;
  uint uVar20;
  uint32_t uVar21;
  size_t z;
  long lVar22;
  StringWriter w;
  char local_69;
  size_t local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  uchar *local_40;
  MD5 *local_38;
  
  this->a0 = 0x67452301;
  this->b0 = 0xefcdab89;
  this->c0 = 0x98badcfe;
  this->d0 = 0x10325476;
  if (n < 0x40) {
    lVar22 = 0;
  }
  else {
    uVar21 = 0x10325476;
    uVar7 = 0x98badcfe;
    uVar5 = 0xefcdab89;
    uVar13 = 0x67452301;
    lVar16 = 0;
    do {
      uVar15 = 1;
      uVar11 = 5;
      uVar12 = 0;
      lVar22 = 0;
      uVar14 = 0;
      uVar9 = uVar5;
      uVar10 = uVar21;
      uVar19 = uVar7;
      uVar6 = uVar13;
      do {
        uVar1 = uVar19;
        uVar20 = uVar10;
        uVar19 = uVar9;
        if (uVar14 < 0x10) {
          uVar8 = (uVar1 ^ uVar20) & uVar19 ^ uVar20;
          uVar3 = uVar14;
        }
        else {
          if (uVar14 < 0x20) {
            uVar8 = (uVar19 ^ uVar1) & uVar20 ^ uVar1;
            uVar9 = uVar15;
          }
          else if (uVar14 < 0x30) {
            uVar8 = uVar20 ^ uVar19 ^ uVar1;
            uVar9 = uVar11;
          }
          else {
            uVar8 = (~uVar20 | uVar19) ^ uVar1;
            uVar9 = uVar12;
          }
          uVar3 = (ulong)(uVar9 & 0xf);
        }
        uVar9 = uVar8 + uVar6 +
                *(int *)((long)&MD5(void_const*,unsigned_long)::$_0::operator()(void_const*)::
                                sine_table + lVar22) + *(int *)(d + uVar3 * 4 + lVar16);
        uVar9 = (uVar9 << ((&MD5(void_const*,unsigned_long)::$_0::operator()(void_const*)::shifts)
                           [lVar22] & 0x1f) |
                uVar9 >> 0x20 - ((&MD5(void_const*,unsigned_long)::$_0::operator()(void_const*)::
                                   shifts)[lVar22] & 0x1f)) + uVar19;
        uVar14 = uVar14 + 1;
        uVar15 = uVar15 + 5;
        uVar11 = uVar11 + 3;
        lVar22 = lVar22 + 4;
        uVar12 = uVar12 + 7;
        uVar10 = uVar1;
        uVar6 = uVar20;
      } while (uVar14 != 0x40);
      uVar13 = uVar13 + uVar20;
      uVar5 = uVar5 + uVar9;
      uVar7 = uVar7 + uVar19;
      uVar21 = uVar21 + uVar1;
      lVar22 = lVar16 + 0x40;
      uVar14 = lVar16 + 0x7f;
      lVar16 = lVar22;
    } while (uVar14 < n);
    this->a0 = uVar13;
    this->b0 = uVar5;
    this->c0 = uVar7;
    this->d0 = uVar21;
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_68 = n;
  local_40 = d;
  local_38 = this;
  StringWriter::write((StringWriter *)&local_60,(int)d + (int)lVar22,(void *)(n - lVar22),
                      (size_t)local_60._M_dataplus._M_p);
  local_69 = -0x80;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_60,&local_69,1);
  sVar2 = StringWriter::size((StringWriter *)&local_60);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (&local_60,(ulong)(0x38 < sVar2) * 0x40 + 0x40,'\0');
  sVar2 = StringWriter::size((StringWriter *)&local_60);
  if (local_60._M_string_length < sVar2) {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (&local_60,sVar2,'\0');
  }
  *(size_t *)(local_60._M_dataplus._M_p + (sVar2 - 8)) = local_68 << 3;
  uVar14 = 0;
  while( true ) {
    sVar2 = StringWriter::size((StringWriter *)&local_60);
    if (sVar2 <= uVar14) break;
    uVar5 = this->b0;
    uVar13 = this->c0;
    uVar21 = this->d0;
    uVar9 = 1;
    uVar19 = 5;
    uVar12 = 0;
    lVar22 = 0;
    uVar3 = 0;
    uVar6 = this->a0;
    uVar7 = uVar5;
    uVar10 = uVar13;
    uVar18 = uVar21;
    do {
      uVar15 = uVar18;
      uVar18 = uVar10;
      uVar10 = uVar7;
      if (uVar3 < 0x10) {
        uVar11 = (uVar18 ^ uVar15) & uVar10 ^ uVar15;
        uVar17 = uVar3;
      }
      else {
        if (uVar3 < 0x20) {
          uVar11 = (uVar10 ^ uVar18) & uVar15 ^ uVar18;
          uVar7 = uVar9;
        }
        else if (uVar3 < 0x30) {
          uVar11 = uVar15 ^ uVar10 ^ uVar18;
          uVar7 = uVar19;
        }
        else {
          uVar11 = (~uVar15 | uVar10) ^ uVar18;
          uVar7 = uVar12;
        }
        uVar17 = (ulong)(uVar7 & 0xf);
      }
      uVar7 = uVar11 + uVar6 +
              *(int *)((long)&MD5(void_const*,unsigned_long)::$_0::operator()(void_const*)::
                              sine_table + lVar22) +
              *(int *)(local_60._M_dataplus._M_p + uVar17 * 4 + uVar14);
      uVar7 = (uVar7 << ((&MD5(void_const*,unsigned_long)::$_0::operator()(void_const*)::shifts)
                         [lVar22] & 0x1f) |
              uVar7 >> 0x20 - ((&MD5(void_const*,unsigned_long)::$_0::operator()(void_const*)::
                                 shifts)[lVar22] & 0x1f)) + uVar10;
      uVar3 = uVar3 + 1;
      uVar9 = uVar9 + 5;
      uVar19 = uVar19 + 3;
      lVar22 = lVar22 + 4;
      uVar12 = uVar12 + 7;
      uVar6 = uVar15;
    } while (uVar3 != 0x40);
    local_38->a0 = uVar15 + this->a0;
    local_38->b0 = uVar7 + uVar5;
    local_38->c0 = uVar10 + uVar13;
    local_38->d0 = uVar18 + uVar21;
    uVar14 = uVar14 + 0x40;
    this = local_38;
  }
  paVar4 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar4) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
    paVar4 = extraout_RAX;
  }
  return (uchar *)paVar4;
}

Assistant:

MD5::MD5(const void* data, size_t size) {
  this->a0 = 0x67452301;
  this->b0 = 0xEFCDAB89;
  this->c0 = 0x98BADCFE;
  this->d0 = 0x10325476;

  auto process_block = [this](const void* block) -> void {
    // clang-format off
    static const uint32_t shifts[64] = {
        7, 12, 17, 22,  7, 12, 17, 22,  7, 12, 17, 22,  7, 12, 17, 22,
        5,  9, 14, 20,  5,  9, 14, 20,  5,  9, 14, 20,  5,  9, 14, 20,
        4, 11, 16, 23,  4, 11, 16, 23,  4, 11, 16, 23,  4, 11, 16, 23,
        6, 10, 15, 21,  6, 10, 15, 21,  6, 10, 15, 21,  6, 10, 15, 21};
    static const uint32_t sine_table[64] = {
        0xD76AA478, 0xE8C7B756, 0x242070DB, 0xC1BDCEEE,
        0xF57C0FAF, 0x4787C62A, 0xA8304613, 0xFD469501,
        0x698098D8, 0x8B44F7AF, 0xFFFF5BB1, 0x895CD7BE,
        0x6B901122, 0xFD987193, 0xA679438E, 0x49B40821,
        0xF61E2562, 0xC040B340, 0x265E5A51, 0xE9B6C7AA,
        0xD62F105D, 0x02441453, 0xD8A1E681, 0xE7D3FBC8,
        0x21E1CDE6, 0xC33707D6, 0xF4D50D87, 0x455A14ED,
        0xA9E3E905, 0xFCEFA3F8, 0x676F02D9, 0x8D2A4C8A,
        0xFFFA3942, 0x8771F681, 0x6D9D6122, 0xFDE5380C,
        0xA4BEEA44, 0x4BDECFA9, 0xF6BB4B60, 0xBEBFBC70,
        0x289B7EC6, 0xEAA127FA, 0xD4EF3085, 0x04881D05,
        0xD9D4D039, 0xE6DB99E5, 0x1FA27CF8, 0xC4AC5665,
        0xF4292244, 0x432AFF97, 0xAB9423A7, 0xFC93A039,
        0x655B59C3, 0x8F0CCC92, 0xFFEFF47D, 0x85845DD1,
        0x6FA87E4F, 0xFE2CE6E0, 0xA3014314, 0x4E0811A1,
        0xF7537E82, 0xBD3AF235, 0x2AD7D2BB, 0xEB86D391};
    // clang-format on
    const le_uint32_t* fields = reinterpret_cast<const le_uint32_t*>(block);

    uint32_t a = this->a0, b = this->b0, c = this->c0, d = this->d0;
    for (size_t x = 0; x < 64; x++) {
      uint32_t f, g;
      if (x < 16) {
        f = (b & c) | ((~b) & d);
        g = x;
      } else if (x < 32) {
        f = (b & d) | (c & (~d));
        g = ((5 * x) + 1) & 15;
      } else if (x < 48) {
        f = b ^ c ^ d;
        g = ((3 * x) + 5) & 15;
      } else {
        f = c ^ (b | (~d));
        g = (7 * x) & 15;
      }
      uint32_t dt = d;
      uint32_t b_addend = a + f + sine_table[x] + fields[g];
      d = c;
      c = b;
      b = b + ((b_addend << shifts[x]) | (b_addend >> (32 - shifts[x])));
      a = dt;
    }
    this->a0 += a;
    this->b0 += b;
    this->c0 += c;
    this->d0 += d;
  };

  // Process all possible blocks from the input until just before the end
  size_t processed_offset;
  for (processed_offset = 0; processed_offset + 0x3F < size; processed_offset += 0x40) {
    process_block(reinterpret_cast<const uint8_t*>(data) + processed_offset);
  }

  // Make a copy of the last (possibly incomplete) block, append the trailer,
  // and process what remains. This could result in either one or two blocks.
  StringWriter w;
  w.write(reinterpret_cast<const char*>(data) + processed_offset, size - processed_offset);
  {
    w.put_u8(0x80);
    w.extend_to((w.size() > 0x38) ? 0x80 : 0x40, '\0');
    w.pput_u64l(w.size() - 8, size << 3);
  }
  for (size_t z = 0; z < w.size(); z += 0x40) {
    process_block(w.str().data() + z);
  }
}